

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

Test * __thiscall
testing::internal::TestFactoryImpl<ImplDispatchTest_AES_set_encrypt_key_Test>::CreateTest
          (TestFactoryImpl<ImplDispatchTest_AES_set_encrypt_key_Test> *this)

{
  Test *this_00;
  TestFactoryImpl<ImplDispatchTest_AES_set_encrypt_key_Test> *this_local;
  
  this_00 = (Test *)operator_new(0x18);
  ImplDispatchTest_AES_set_encrypt_key_Test::ImplDispatchTest_AES_set_encrypt_key_Test
            ((ImplDispatchTest_AES_set_encrypt_key_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override { return new TestClass; }